

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gensprep.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  EVP_PKEY_CTX *ctx;
  size_t local_70;
  UErrorCode local_58;
  uint local_54;
  UErrorCode errorCode;
  int32_t sprepOptions;
  char *basename;
  char *inputFileName;
  char *bundleName;
  char *icuUniDataDir;
  char *destDir;
  char *srcDir;
  char *filename;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  srcDir = (char *)0x0;
  destDir = (char *)0x0;
  icuUniDataDir = (char *)0x0;
  bundleName = (char *)0x0;
  inputFileName = (char *)0x0;
  basename = (char *)0x0;
  _errorCode = (char *)0x0;
  local_54 = 0;
  local_58 = U_ZERO_ERROR;
  filename = (char *)argv;
  argv_local._0_4_ = argc;
  options[4].value = u_getDataDirectory_63();
  options[5].value = "";
  options[0xb].value = "0";
  options[7].value = "sprep";
  options[8].value = "";
  argv_local._0_4_ = u_parseArgs((int)argv_local,(char **)filename,0xc,options);
  if ((int)argv_local < 0) {
    fprintf(_stderr,"error in command line argument \"%s\"\n",
            *(undefined8 *)(filename + (long)-(int)argv_local * 8));
  }
  if ((((int)argv_local < 0) || (options[0].doesOccur != '\0')) || (options[1].doesOccur != '\0')) {
    iVar1 = printHelp((int)argv_local,(char **)filename);
    return iVar1;
  }
  beVerbose = options[2].doesOccur;
  haveCopyright = options[3].doesOccur;
  destDir = options[5].value;
  icuUniDataDir = options[4].value;
  inputFileName = options[7].value;
  if (options[8].doesOccur == '\0') {
    bundleName = options[9].value;
  }
  else {
    bundleName = options[8].value;
  }
  if (1 < (int)argv_local) {
    basename = *(char **)(filename + 8);
    if (options[0xb].doesOccur == '\0') {
      iVar1 = printHelp((int)argv_local,(char **)filename);
      return iVar1;
    }
    if (options[6].doesOccur != '\0') {
      u_setDataDirectory_63(options[6].value);
    }
    setUnicodeVersion(options[0xb].value);
    sVar2 = strlen(destDir);
    sVar3 = strlen(basename);
    if (bundleName == (char *)0x0) {
      local_70 = 0;
    }
    else {
      local_70 = strlen(bundleName);
    }
    srcDir = (char *)uprv_malloc_63(sVar2 + sVar3 + local_70 + 0x28);
    pcVar4 = strchr(destDir,0x2f);
    if ((pcVar4 == (char *)0x0) && (pcVar4 = strchr(destDir,0x2f), pcVar4 == (char *)0x0)) {
      *srcDir = '.';
      srcDir[1] = '/';
      strcpy(srcDir + 2,destDir);
    }
    else {
      strcpy(srcDir,destDir);
    }
    pcVar4 = srcDir;
    ctx = (EVP_PKEY_CTX *)srcDir;
    sVar2 = strlen(srcDir);
    pcVar4 = pcVar4 + sVar2;
    _errorCode = pcVar4;
    if ((srcDir < pcVar4) && (pcVar4[-1] != '/')) {
      _errorCode = pcVar4 + 1;
      *pcVar4 = '/';
    }
    init(ctx);
    strcpy(_errorCode,basename);
    parseMappings(srcDir,'\0',&local_58);
    pcVar4 = srcDir;
    __stream = _stderr;
    if (local_58 < U_ILLEGAL_ARGUMENT_ERROR) {
      if (options[8].doesOccur != '\0') {
        strcpy(srcDir,bundleName);
        pcVar4 = srcDir;
        sVar2 = strlen(srcDir);
        pcVar4 = pcVar4 + sVar2;
        _errorCode = pcVar4;
        if ((srcDir < pcVar4) && (pcVar4[-1] != '/')) {
          _errorCode = pcVar4 + 1;
          *pcVar4 = '/';
        }
        pcVar4 = _errorCode + 1;
        *_errorCode = '/';
        _errorCode = pcVar4;
        strcpy(pcVar4,"NormalizationCorrections.txt");
        parseNormalizationCorrections(srcDir,&local_58);
        if (U_ZERO_ERROR < local_58) {
          fprintf(_stderr,"Could not open file %s for reading \n",srcDir);
          return local_58;
        }
        local_54 = local_54 | 1;
      }
      if (options[10].doesOccur != '\0') {
        local_54 = local_54 | 2;
      }
      setOptions(local_54);
      if (local_58 < U_ILLEGAL_ARGUMENT_ERROR) {
        generateData(icuUniDataDir,inputFileName);
        cleanUpData();
      }
      uprv_free_63(srcDir);
      u_cleanup_63();
      argv_local._4_4_ = local_58;
    }
    else {
      pcVar5 = u_errorName_63(local_58);
      fprintf(__stream,"Could not open file %s for reading. Error: %s \n",pcVar4,pcVar5);
      argv_local._4_4_ = local_58;
    }
    return argv_local._4_4_;
  }
  iVar1 = printHelp((int)argv_local,(char **)filename);
  return iVar1;
}

Assistant:

extern int
main(int argc, char* argv[]) {
#if !UCONFIG_NO_IDNA
    char* filename = NULL;
#endif
    const char *srcDir=NULL, *destDir=NULL, *icuUniDataDir=NULL;
    const char *bundleName=NULL, *inputFileName = NULL;
    char *basename=NULL;
    int32_t sprepOptions = 0;

    UErrorCode errorCode=U_ZERO_ERROR;

    U_MAIN_INIT_ARGS(argc, argv);

    /* preset then read command line options */
    options[DESTDIR].value=u_getDataDirectory();
    options[SOURCEDIR].value="";
    options[UNICODE_VERSION].value="0"; /* don't assume the unicode version */
    options[BUNDLE_NAME].value = DATA_NAME;
    options[NORMALIZE].value = "";

    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);

    /* error handling, printing usage message */
    if(argc<0) {
        fprintf(stderr,
            "error in command line argument \"%s\"\n",
            argv[-argc]);
    }
    if(argc<0 || options[HELP].doesOccur || options[HELP_QUESTION_MARK].doesOccur) {
        return printHelp(argc, argv);
        
    }

    /* get the options values */
    beVerbose=options[VERBOSE].doesOccur;
    haveCopyright=options[COPYRIGHT].doesOccur;
    srcDir=options[SOURCEDIR].value;
    destDir=options[DESTDIR].value;
    bundleName = options[BUNDLE_NAME].value;
    if(options[NORMALIZE].doesOccur) {
        icuUniDataDir = options[NORMALIZE].value;
    } else {
        icuUniDataDir = options[NORM_CORRECTION_DIR].value;
    }

    if(argc<2) {
        /* print the help message */
        return printHelp(argc, argv);
    } else {
        inputFileName = argv[1];
    }
    if(!options[UNICODE_VERSION].doesOccur){
        return printHelp(argc, argv);
    }
    if(options[ICUDATADIR].doesOccur) {
        u_setDataDirectory(options[ICUDATADIR].value);
    }
#if UCONFIG_NO_IDNA

    fprintf(stderr,
        "gensprep writes dummy " U_ICUDATA_NAME "_" DATA_NAME "." DATA_TYPE
        " because UCONFIG_NO_IDNA is set, \n"
        "see icu/source/common/unicode/uconfig.h\n");
    generateData(destDir, bundleName);

#else

    setUnicodeVersion(options[UNICODE_VERSION].value);
    filename = (char* ) uprv_malloc(uprv_strlen(srcDir) + uprv_strlen(inputFileName) + (icuUniDataDir == NULL ? 0 : uprv_strlen(icuUniDataDir)) + 40); /* hopefully this should be enough */
   
    /* prepare the filename beginning with the source dir */
    if(uprv_strchr(srcDir,U_FILE_SEP_CHAR) == NULL && uprv_strchr(srcDir,U_FILE_ALT_SEP_CHAR) == NULL){
        filename[0] = '.';
        filename[1] = U_FILE_SEP_CHAR;
        uprv_strcpy(filename+2,srcDir);
    }else{
        uprv_strcpy(filename, srcDir);
    }
    
    basename=filename+uprv_strlen(filename);
    if(basename>filename && *(basename-1)!=U_FILE_SEP_CHAR) {
        *basename++=U_FILE_SEP_CHAR;
    }
    
    /* initialize */
    init();

    /* process the file */
    uprv_strcpy(basename,inputFileName);
    parseMappings(filename,FALSE, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "Could not open file %s for reading. Error: %s \n", filename, u_errorName(errorCode));
        return errorCode;
    }
    
    if(options[NORMALIZE].doesOccur){ /* this option might be set by @normalize;; in the source file */
        /* set up directory for NormalizationCorrections.txt */
        uprv_strcpy(filename,icuUniDataDir);
        basename=filename+uprv_strlen(filename);
        if(basename>filename && *(basename-1)!=U_FILE_SEP_CHAR) {
            *basename++=U_FILE_SEP_CHAR;
        }

        *basename++=U_FILE_SEP_CHAR;
        uprv_strcpy(basename,NORM_CORRECTIONS_FILE_NAME);
    
        parseNormalizationCorrections(filename,&errorCode);
        if(U_FAILURE(errorCode)){
            fprintf(stderr,"Could not open file %s for reading \n", filename);
            return errorCode;
        }
        sprepOptions |= _SPREP_NORMALIZATION_ON;
    }
    
    if(options[CHECK_BIDI].doesOccur){ /* this option might be set by @check-bidi;; in the source file */
        sprepOptions |= _SPREP_CHECK_BIDI_ON;
    }

    setOptions(sprepOptions);

    /* process parsed data */
    if(U_SUCCESS(errorCode)) {
        /* write the data file */
        generateData(destDir, bundleName);

        cleanUpData();
    }

    uprv_free(filename);

    u_cleanup();

#endif

    return errorCode;
}